

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function.h
# Opt level: O3

void __thiscall
kj::Function<void_(kj::AsyncIoProvider_&,_kj::AsyncIoStream_&,_kj::WaitScope_&)>::
Impl<(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/capnp/rpc-twoparty-test.c++:403:35)>
::operator()(Impl<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_rpc_twoparty_test_c__:403:35)>
             *this,AsyncIoProvider *params,AsyncIoStream *params_1,WaitScope *params_2)

{
  PromiseNode *pPVar1;
  ReaderOptions receiveOptions;
  RpcSystem<capnp::rpc::twoparty::VatId> server;
  TwoPartyVatNetwork network;
  undefined1 local_320 [8];
  PromiseNode *local_318;
  RpcSystemBase local_310;
  ExceptionOrValue local_300;
  undefined1 local_1a0;
  TwoPartyVatNetwork local_198;
  
  receiveOptions._8_8_ = 0x40;
  receiveOptions.traversalLimitInWords = 0x800000;
  capnp::TwoPartyVatNetwork::TwoPartyVatNetwork(&local_198,params_1,SERVER,receiveOptions);
  capnp::
  makeRpcServer<capnp::rpc::twoparty::VatId,capnp::rpc::twoparty::ProvisionId,capnp::rpc::twoparty::RecipientId,capnp::rpc::twoparty::ThirdPartyCapId,capnp::rpc::twoparty::JoinResult>
            ((capnp *)&local_310,&local_198.super_TwoPartyVatNetworkBase,(this->f).bootstrapFactory)
  ;
  kj::_::ForkHub<kj::_::Void>::addBranch((ForkHub<kj::_::Void> *)local_320);
  local_300.exception.ptr.isSet = false;
  local_1a0 = '\0';
  kj::_::waitImpl((Own<kj::_::PromiseNode> *)local_320,&local_300,params_2);
  if (local_1a0 == '\x01') {
    if (local_300.exception.ptr.isSet != false) {
      throwRecoverableException(&local_300.exception.ptr.field_1.value,0);
    }
  }
  else {
    if (local_300.exception.ptr.isSet == false) {
      kj::_::unreachable();
    }
    throwRecoverableException(&local_300.exception.ptr.field_1.value,0);
  }
  if (local_300.exception.ptr.isSet == true) {
    Exception::~Exception(&local_300.exception.ptr.field_1.value);
  }
  pPVar1 = local_318;
  if (local_318 != (PromiseNode *)0x0) {
    local_318 = (PromiseNode *)0x0;
    (**(code **)*(_func_int **)local_320)
              (local_320,pPVar1->_vptr_PromiseNode[-2] + (long)&pPVar1->_vptr_PromiseNode);
  }
  capnp::_::RpcSystemBase::~RpcSystemBase(&local_310);
  capnp::TwoPartyVatNetwork::~TwoPartyVatNetwork(&local_198);
  return;
}

Assistant:

Return operator()(Params... params) override {
      return f(kj::fwd<Params>(params)...);
    }